

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BinaryAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::BinaryAssertionExpr,slang::ast::BinaryAssertionOperator&,slang::ast::AssertionExpr_const&,slang::ast::AssertionExpr_const&,slang::SourceRange>
          (BumpAllocator *this,BinaryAssertionOperator *args,AssertionExpr *args_1,
          AssertionExpr *args_2,SourceRange *args_3)

{
  BinaryAssertionOperator BVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  BinaryAssertionExpr *pBVar4;
  
  pBVar4 = (BinaryAssertionExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BinaryAssertionExpr *)this->endPtr < pBVar4 + 1) {
    pBVar4 = (BinaryAssertionExpr *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pBVar4 + 1);
  }
  BVar1 = *args;
  SVar2 = args_3->startLoc;
  SVar3 = args_3->endLoc;
  (pBVar4->super_AssertionExpr).kind = Binary;
  (pBVar4->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pBVar4->op = BVar1;
  pBVar4->left = args_1;
  pBVar4->right = args_2;
  (pBVar4->opRange).startLoc = SVar2;
  (pBVar4->opRange).endLoc = SVar3;
  return pBVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }